

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void detectStreamReader(char *fileName,MPLSParser *mplsParser,bool isSubMode)

{
  uint64_t uVar1;
  bool bVar2;
  pointer *this;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  string local_288;
  int64_t local_268;
  uint64_t time;
  size_t j;
  vector<AVChapter,_std::allocator<AVChapter>_> *local_238;
  AVChapters *chapters;
  string local_210;
  uint local_1ec;
  string local_1e8;
  int local_1c4;
  undefined1 local_1c0 [4];
  int pgTrackNum;
  MPLSStreamInfo mplsStreamInfo_1;
  string descr;
  string postfix;
  MPLSStreamInfo mplsStreamInfo;
  uint i;
  vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *streams;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  DetectStreamRez streamInfo;
  bool isSubMode_local;
  MPLSParser *mplsParser_local;
  char *fileName_local;
  
  streamInfo.fileDurationNano._7_1_ = isSubMode;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,fileName,&local_79);
  METADemuxer::DetectStreamReader
            ((DetectStreamRez *)local_58,&readManager,&local_78,mplsParser == (MPLSParser *)0x0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  this = &streamInfo.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  for (mplsStreamInfo._108_4_ = 0;
      sVar3 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::size
                        ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this),
      (uint)mplsStreamInfo._108_4_ < sVar3; mplsStreamInfo._108_4_ = mplsStreamInfo._108_4_ + 1) {
    pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                       ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                        (ulong)(uint)mplsStreamInfo._108_4_);
    if (pvVar4->trackID != 0) {
      if (mplsStreamInfo._108_4_ != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Track ID:    ");
      pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                         ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                          (ulong)(uint)mplsStreamInfo._108_4_);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar4->trackID);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
    }
    pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                       ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                        (ulong)(uint)mplsStreamInfo._108_4_);
    if ((pvVar4->codecInfo).codecID == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Can\'t detect stream type");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
    }
    else {
      if (mplsParser != (MPLSParser *)0x0) {
        pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                           ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                            (ulong)(uint)mplsStreamInfo._108_4_);
        MPLSParser::getStreamByPID
                  ((MPLSStreamInfo *)((long)&postfix.field_2 + 8),mplsParser,pvVar4->trackID);
        if (postfix.field_2._8_4_ == 0) {
          pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                             ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                              (ulong)(uint)mplsStreamInfo._108_4_);
          if (((pvVar4->codecInfo).codecID != 0xe) || ((mplsParser->isDependStreamExist & 1U) == 0))
          {
            pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                               ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                                (ulong)(uint)mplsStreamInfo._108_4_);
            pvVar4->unused = true;
          }
        }
        else if ((mplsStreamInfo.super_M2TSStreamInfo.aspect_ratio_index & 1) != 0) {
          pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                             ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                              (ulong)(uint)mplsStreamInfo._108_4_);
          pvVar4->isSecondary = true;
        }
        MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)((long)&postfix.field_2 + 8));
      }
      std::__cxx11::string::string((string *)(descr.field_2._M_local_buf + 8));
      if (((streamInfo.fileDurationNano._7_1_ & 1) != 0) &&
         (pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                             ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                              (ulong)(uint)mplsStreamInfo._108_4_),
         (pvVar4->codecInfo).codecID == 0xc)) {
        std::__cxx11::string::operator=
                  ((string *)(descr.field_2._M_local_buf + 8)," (depended view)");
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Stream type: ");
      pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                         ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                          (ulong)(uint)mplsStreamInfo._108_4_);
      poVar5 = std::operator<<(poVar5,(string *)&(pvVar4->codecInfo).displayName);
      poVar5 = std::operator<<(poVar5,(string *)(descr.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
      pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                         ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                          (ulong)(uint)mplsStreamInfo._108_4_);
      if ((pvVar4->isSecondary & 1U) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Secondary: 1");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                         ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                          (ulong)(uint)mplsStreamInfo._108_4_);
      if ((pvVar4->unused & 1U) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Unselected: 1");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Stream ID:   ");
      pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                         ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                          (ulong)(uint)mplsStreamInfo._108_4_);
      poVar5 = std::operator<<(poVar5,(string *)&(pvVar4->codecInfo).programName);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
      pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                         ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                          (ulong)(uint)mplsStreamInfo._108_4_);
      std::__cxx11::string::string
                ((string *)&mplsStreamInfo_1.pipParams.lumma,(string *)&pvVar4->streamDescr);
      pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                         ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                          (ulong)(uint)mplsStreamInfo._108_4_);
      if ((((pvVar4->codecInfo).codecID == 0xc) && (mplsParser != (MPLSParser *)0x0)) &&
         ((mplsParser->isDependStreamExist & 1U) != 0)) {
        pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                           ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                            (ulong)(uint)mplsStreamInfo._108_4_);
        MPLSParser::getStreamByPID((MPLSStreamInfo *)local_1c0,mplsParser,pvVar4->trackID);
        local_1c4 = (int)local_1c0 + -0x1200;
        if (local_1c4 < 0) {
          std::__cxx11::string::operator+=
                    ((string *)&mplsStreamInfo_1.pipParams.lumma,"   (disabled)");
        }
        else {
          if (mplsStreamInfo_1.super_M2TSStreamInfo.m_index.
              super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ == 0xff) {
            std::__cxx11::string::operator+=
                      ((string *)&mplsStreamInfo_1.pipParams.lumma,"   3d-plane: undefined");
          }
          else {
            std::__cxx11::string::operator+=
                      ((string *)&mplsStreamInfo_1.pipParams.lumma,"   3d-plane: ");
            local_1ec = (uint)mplsStreamInfo_1.super_M2TSStreamInfo.m_index.
                              super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_;
            int32ToStr_abi_cxx11_(&local_1e8,(int32_t *)&local_1ec);
            std::__cxx11::string::operator+=
                      ((string *)&mplsStreamInfo_1.pipParams.lumma,(string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1e8);
          }
          if ((mplsStreamInfo_1.super_M2TSStreamInfo.m_index.
               super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) != 0) {
            std::__cxx11::string::operator+=
                      ((string *)&mplsStreamInfo_1.pipParams.lumma,"   (stereo, right=");
            pcVar7 = "";
            if ((mplsStreamInfo_1.leftEye)->type == '\x02') {
              pcVar7 = "dep-view ";
            }
            std::__cxx11::string::operator+=((string *)&mplsStreamInfo_1.pipParams.lumma,pcVar7);
            int32ToStr_abi_cxx11_(&local_210,(int32_t *)mplsStreamInfo_1.leftEye);
            std::__cxx11::string::operator+=
                      ((string *)&mplsStreamInfo_1.pipParams.lumma,(string *)&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::operator+=((string *)&mplsStreamInfo_1.pipParams.lumma,", left=");
            pcVar7 = "";
            if (*(char *)(mplsStreamInfo_1._64_8_ + 0x40) == '\x02') {
              pcVar7 = "dep-view ";
            }
            std::__cxx11::string::operator+=((string *)&mplsStreamInfo_1.pipParams.lumma,pcVar7);
            int32ToStr_abi_cxx11_((string *)&chapters,(int32_t *)mplsStreamInfo_1._64_8_);
            std::__cxx11::string::operator+=
                      ((string *)&mplsStreamInfo_1.pipParams.lumma,(string *)&chapters);
            std::__cxx11::string::~string((string *)&chapters);
            std::__cxx11::string::operator+=((string *)&mplsStreamInfo_1.pipParams.lumma,")");
          }
        }
        MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)local_1c0);
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Stream info: ");
      poVar5 = std::operator<<(poVar5,(string *)&mplsStreamInfo_1.pipParams.lumma);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
      poVar5 = std::operator<<((ostream *)&std::cout,"Stream lang: ");
      pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                         ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                          (ulong)(uint)mplsStreamInfo._108_4_);
      poVar5 = std::operator<<(poVar5,(string *)&pvVar4->lang);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
      pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                         ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                          (ulong)(uint)mplsStreamInfo._108_4_);
      if (pvVar4->delay != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Stream delay: ");
        pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                           ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                            (ulong)(uint)mplsStreamInfo._108_4_);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar4->delay);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                         ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                          (ulong)(uint)mplsStreamInfo._108_4_);
      if ((pvVar4->multiSubStream & 1U) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"subTrack: ");
        pvVar4 = std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator[]
                           ((vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> *)this,
                            (ulong)(uint)mplsStreamInfo._108_4_);
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,((pvVar4->codecInfo).codecID != 0xe) + 1);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        sLastMsg = true;
      }
      std::__cxx11::string::~string((string *)&mplsStreamInfo_1.pipParams.lumma);
      std::__cxx11::string::~string((string *)(descr.field_2._M_local_buf + 8));
    }
  }
  local_238 = (vector<AVChapter,_std::allocator<AVChapter>_> *)local_58;
  bVar2 = std::vector<AVChapter,_std::allocator<AVChapter>_>::empty(local_238);
  if ((!bVar2) ||
     (0 < (long)streamInfo.streams.
                super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage)) {
    poVar5 = std::operator<<((ostream *)&std::cout,"");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    sLastMsg = true;
  }
  if (streamInfo.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Duration: ");
    floatToTime_abi_cxx11_
              ((string *)&j,
               (double)(long)streamInfo.streams.
                             super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage / 1000000000.0,'.');
    poVar5 = std::operator<<(poVar5,(string *)&j);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&j);
    sLastMsg = true;
  }
  for (time = 0; uVar1 = time,
      sVar3 = std::vector<AVChapter,_std::allocator<AVChapter>_>::size(local_238), uVar1 < sVar3;
      time = time + 1) {
    pvVar6 = std::vector<AVChapter,_std::allocator<AVChapter>_>::operator[](local_238,time);
    local_268 = pvVar6->start;
    if (time % 5 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
      std::operator<<((ostream *)&std::cout,"Marks: ");
      sLastMsg = true;
    }
    auVar8._8_4_ = (int)((ulong)local_268 >> 0x20);
    auVar8._0_8_ = local_268;
    auVar8._12_4_ = 0x45300000;
    floatToTime_abi_cxx11_
              (&local_288,
               ((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_268) - 4503599627370496.0)) / 1000000000.0,
               '.');
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_288);
    std::operator<<(poVar5," ");
    std::__cxx11::string::~string((string *)&local_288);
    sLastMsg = true;
  }
  bVar2 = std::vector<AVChapter,_std::allocator<AVChapter>_>::empty(local_238);
  if ((!bVar2) ||
     (0 < (long)streamInfo.streams.
                super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage)) {
    poVar5 = std::operator<<((ostream *)&std::cout,"");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    sLastMsg = true;
  }
  DetectStreamRez::~DetectStreamRez((DetectStreamRez *)local_58);
  return;
}

Assistant:

void detectStreamReader(const char* fileName, MPLSParser* mplsParser, bool isSubMode)
{
    DetectStreamRez streamInfo = METADemuxer::DetectStreamReader(readManager, fileName, mplsParser == nullptr);
    vector<CheckStreamRez>& streams = streamInfo.streams;

    for (unsigned i = 0; i < streams.size(); i++)
    {
        if (streams[i].trackID != 0)
        {
            if (i > 0)
                LTRACE(LT_INFO, 2, "");
            LTRACE(LT_INFO, 2, "Track ID:    " << streams[i].trackID);
        }
        if (streams[i].codecInfo.codecID)
        {
            if (mplsParser)
            {
                MPLSStreamInfo mplsStreamInfo = mplsParser->getStreamByPID(streams[i].trackID);
                if (mplsStreamInfo.streamPID)
                {
                    if (mplsStreamInfo.isSecondary)
                        streams[i].isSecondary = true;
                }
                else
                {
                    if (!(streams[i].codecInfo.codecID == CODEC_V_MPEG4_H264_DEP && mplsParser->isDependStreamExist))
                        streams[i].unused = true;
                }
            }

            string postfix;
            if (isSubMode && streams[i].codecInfo.codecID == CODEC_S_PGS)
                postfix = " (depended view)";
            LTRACE(LT_INFO, 2, "Stream type: " << streams[i].codecInfo.displayName << postfix);
            if (streams[i].isSecondary)
                LTRACE(LT_INFO, 2, "Secondary: 1");
            if (streams[i].unused)
                LTRACE(LT_INFO, 2, "Unselected: 1");

            LTRACE(LT_INFO, 2, "Stream ID:   " << streams[i].codecInfo.programName);
            std::string descr = streams[i].streamDescr;
            if (streams[i].codecInfo.codecID == CODEC_S_PGS && mplsParser && mplsParser->isDependStreamExist)
            {
                // PG stream
                MPLSStreamInfo mplsStreamInfo = mplsParser->getStreamByPID(streams[i].trackID);
                int pgTrackNum = mplsStreamInfo.streamPID - 0x1200;
                if (pgTrackNum >= 0)
                {
                    if (mplsStreamInfo.offsetId != 0xff)
                    {
                        descr += "   3d-plane: ";
                        descr += int32ToStr(mplsStreamInfo.offsetId);
                    }
                    else
                    {
                        descr += "   3d-plane: undefined";
                    }
                    if (mplsStreamInfo.isSSPG)
                    {
                        descr += "   (stereo, right=";
                        descr += (mplsStreamInfo.rightEye->type == 2 ? "dep-view " : "");
                        descr += int32ToStr(mplsStreamInfo.rightEye->streamPID);
                        descr += ", left=";
                        descr += (mplsStreamInfo.leftEye->type == 2 ? "dep-view " : "");
                        descr += int32ToStr(mplsStreamInfo.leftEye->streamPID);
                        descr += ")";
                    }
                }
                else
                    descr += "   (disabled)";
            }
            LTRACE(LT_INFO, 2, "Stream info: " << descr);
            LTRACE(LT_INFO, 2, "Stream lang: " << streams[i].lang);
            if (streams[i].delay)
                LTRACE(LT_INFO, 2, "Stream delay: " << streams[i].delay);
            if (streams[i].multiSubStream)
                LTRACE(LT_INFO, 2, "subTrack: " << (streams[i].codecInfo.codecID == CODEC_V_MPEG4_H264_DEP ? 1 : 2));
        }
        else
            LTRACE(LT_INFO, 2, "Can't detect stream type");
    }

    AVChapters& chapters = streamInfo.chapters;
    if (!chapters.empty() || streamInfo.fileDurationNano > 0)
        LTRACE(LT_INFO, 2, "");
    if (streamInfo.fileDurationNano)
        LTRACE(LT_INFO, 2, "Duration: " << floatToTime((double)streamInfo.fileDurationNano / 1e9));
    for (size_t j = 0; j < chapters.size(); j++)
    {
        uint64_t time = chapters[j].start;
        if (j % 5 == 0)
        {
            LTRACE(LT_INFO, 2, "");
            LTRACE2(LT_INFO, "Marks: ")
        }
        LTRACE2(LT_INFO, floatToTime((double)time / 1e9) << " ")
    }
    if (!chapters.empty() || streamInfo.fileDurationNano > 0)
        LTRACE(LT_INFO, 2, "");
}